

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

uint32_t zmq::detail::read_u32_network_order(uchar *buf)

{
  bool bVar1;
  uint32_t value;
  uchar *buf_local;
  
  bVar1 = is_little_endian();
  if (bVar1) {
    buf_local._4_4_ =
         (uint)*buf * 0x1000000 + (uint)buf[1] * 0x10000 + (uint)buf[2] * 0x100 + (uint)buf[3];
  }
  else {
    buf_local._4_4_ = *(uint32_t *)buf;
  }
  return buf_local._4_4_;
}

Assistant:

inline uint32_t read_u32_network_order(const unsigned char *buf)
{
    if (is_little_endian()) {
        return (static_cast<uint32_t>(buf[0]) << 24)
               + (static_cast<uint32_t>(buf[1]) << 16)
               + (static_cast<uint32_t>(buf[2]) << 8)
               + static_cast<uint32_t>(buf[3]);
    } else {
        uint32_t value;
        std::memcpy(&value, buf, sizeof(value));
        return value;
    }
}